

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O0

BoxDomain * __thiscall amrex::BoxDomain::rmBox(BoxDomain *this,Box *b)

{
  bool bVar1;
  const_iterator __position;
  const_iterator __first;
  Box *in_RDI;
  BoxList *tmpbl;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  BoxDomain *__range1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  BoxList *in_stack_ffffffffffffff08;
  iterator in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uStack_b8;
  undefined4 local_b4;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  iterator in_stack_ffffffffffffff58;
  undefined1 local_70 [32];
  undefined1 *local_50;
  reference local_48;
  Box *local_40;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_38 [7];
  
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x12785b1);
  local_38[0]._M_current = (Box *)BoxList::begin(in_stack_ffffffffffffff08);
  local_40 = (Box *)BoxList::end(in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_ffffffffffffff10._M_current,
                            (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                             *)in_stack_ffffffffffffff08), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator*(local_38);
    bVar1 = Box::intersects(in_RDI,in_stack_ffffffffffffff28._M_current);
    if (bVar1) {
      boxDiff((Box *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),in_RDI);
      local_50 = local_70;
      in_stack_ffffffffffffff28 =
           std::end<amrex::Vector<amrex::Box,std::allocator<amrex::Box>>>
                     (&in_stack_ffffffffffffff08->m_lbox);
      __gnu_cxx::
      __normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>::
      __normal_iterator<amrex::Box*>
                ((__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                  *)in_stack_ffffffffffffff10._M_current,
                 (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                  *)in_stack_ffffffffffffff08);
      __position = std::begin<amrex::BoxList>(in_stack_ffffffffffffff08);
      __first = std::end<amrex::BoxList>(in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff10 =
           std::vector<amrex::Box,std::allocator<amrex::Box>>::
           insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                     ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      __position._M_current,__first._M_current,in_stack_ffffffffffffff58._M_current)
      ;
      in_stack_ffffffffffffff58 = in_stack_ffffffffffffff10;
      Box::Box(in_stack_ffffffffffffff10._M_current);
      *(ulong *)(local_48->smallend).vect =
           CONCAT44(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      *(ulong *)((local_48->smallend).vect + 2) = CONCAT44(uStack_b8,in_stack_ffffffffffffff44);
      *(ulong *)((local_48->bigend).vect + 1) = CONCAT44(in_stack_ffffffffffffff50,local_b4);
      (local_48->btype).itype = in_stack_ffffffffffffff54;
      BoxList::~BoxList((BoxList *)0x127873e);
    }
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_38);
  }
  BoxList::removeEmpty((BoxList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  BoxList::join((BoxList *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)
                CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  Vector<amrex::Box,_std::allocator<amrex::Box>_>::~Vector
            ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0x12787b4);
  return (BoxDomain *)in_RDI;
}

Assistant:

BoxDomain&
BoxDomain::rmBox (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp;

    for (auto& bx : *this)
    {
        if (bx.intersects(b))
        {
            const BoxList& tmpbl = amrex::boxDiff(bx,b);
            tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
            bx = Box();
        }
    }
    removeEmpty();
    join(tmp);
    return *this;
}